

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O2

void __thiscall CoreML::Result::Result(Result *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"not an error",&local_31);
  Result(this,NO_ERROR,UNKNOWN,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Result::Result()
    : Result(ResultType::NO_ERROR, ResultReason::UNKNOWN, "not an error")
  { }